

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

void Acb_Ntk4CollectAdd(Acb_Ntk_t *pNtk,int iObj,Vec_Int_t *vRes,Vec_Int_t *vDists,int Dist)

{
  int iVar1;
  
  iVar1 = Acb_ObjSetTravIdCur(pNtk,iObj);
  if (iVar1 != 0) {
    return;
  }
  Vec_IntWriteEntry(vDists,iObj,Dist);
  Vec_IntPush(vRes,iObj);
  return;
}

Assistant:

void Acb_Ntk4CollectAdd( Acb_Ntk_t * pNtk, int iObj, Vec_Int_t * vRes, Vec_Int_t * vDists, int Dist )
{
    if ( Acb_ObjSetTravIdCur(pNtk, iObj) )
        return;
    Vec_IntWriteEntry( vDists, iObj, Dist );
    Vec_IntPush( vRes, iObj );
}